

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::RandomizeNormal(real mean,real stddev,Tensor *val)

{
  long in_RDI;
  anon_class_8_1_c254ac82 b;
  normal_distribution<float> distribution;
  result_type_conflict3 in_stack_ffffffffffffffb8;
  result_type_conflict3 in_stack_ffffffffffffffbc;
  normal_distribution<float> *in_stack_ffffffffffffffc0;
  anon_class_8_1_c254ac82 __gen;
  
  std::normal_distribution<float>::normal_distribution
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  __gen.distribution = *(normal_distribution<float> **)(in_RDI + 0x28);
  Dim::size((Dim *)__gen.distribution);
  std::generate<float*,cnn::TensorTools::RandomizeNormal(float,float,cnn::Tensor&)::__0>
            ((float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (float *)0x658ec2,__gen);
  return;
}

Assistant:

void TensorTools::RandomizeNormal(real mean, real stddev, Tensor& val) {
  normal_distribution<real> distribution(mean, stddev);
  auto b = [&] {return distribution(*rndeng);};
#if HAVE_CUDA
  float* t = new float[val.d.size()];
  generate(t, t + val.d.size(), b);
  CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
  delete[] t;
#else
  generate(val.v, val.v + val.d.size(), b);
#endif
}